

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_string.c
# Opt level: O0

mpt_metatype * mpt_iterator_string(char *val,char *sep)

{
  char *pcVar1;
  char *dest;
  size_t vlen;
  size_t slen;
  mpt_parseIterator *it;
  char *sep_local;
  char *val_local;
  
  it = (mpt_parseIterator *)sep;
  if (val == (char *)0x0) {
    dest = (char *)0x0;
    vlen = 0;
  }
  else {
    if (sep == (char *)0x0) {
      it = (mpt_parseIterator *)anon_var_dwarf_14504;
    }
    vlen = strlen((char *)it);
    dest = (char *)strlen(val);
  }
  val_local = (char *)malloc((size_t)(dest + vlen + 0x52));
  if (val_local == (char *)0x0) {
    val_local = (char *)0x0;
  }
  else {
    *(_mpt_vptr_metatype **)val_local = &mpt_iterator_string::ctlMeta;
    *(_mpt_vptr_iterator **)(val_local + 8) = &mpt_iterator_string::ctlIter;
    *(_mpt_vptr_convertable **)(val_local + 0x10) = &mpt_iterator_string::ctlConv;
    *(char **)(val_local + 0x18) = val_local + 0x28;
    val_local[0x20] = -0x80;
    val_local[0x21] = '\0';
    val_local[0x22] = '\0';
    val_local[0x23] = '\0';
    val_local[0x24] = '\0';
    val_local[0x25] = '\0';
    val_local[0x26] = '\0';
    val_local[0x27] = '\0';
    *(char **)(val_local + 0x28) = val_local + 0x10;
    pcVar1 = val_local + 0x50;
    if (vlen != 0) {
      memcpy(pcVar1,it,vlen);
    }
    pcVar1[vlen] = '\0';
    pcVar1 = pcVar1 + vlen + 1;
    if (dest != (char *)0x0) {
      memcpy(pcVar1,val,(size_t)dest);
    }
    pcVar1[(long)dest] = '\0';
    *(char **)(val_local + 0x30) = pcVar1;
    *(char **)(val_local + 0x38) = pcVar1 + (long)dest;
    val_local[0x40] = '\0';
    val_local[0x41] = '\0';
    val_local[0x42] = '\0';
    val_local[0x43] = '\0';
    val_local[0x44] = '\0';
    val_local[0x45] = '\0';
    val_local[0x46] = '\0';
    val_local[0x47] = '\0';
    val_local[0x48] = '\0';
  }
  return (mpt_metatype *)val_local;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_iterator_string(const char *val, const char *sep)
{
	static const MPT_INTERFACE_VPTR(metatype) ctlMeta = {
		{ parseConv },
		parseUnref,
		parseRef,
		parseClone
	};
	static const MPT_INTERFACE_VPTR(iterator) ctlIter = {
		parseValue,
		parseAdvance,
		parseReset
	};
	static const MPT_INTERFACE_VPTR(convertable) ctlConv = {
		parseConvertElement
	};
	MPT_STRUCT(parseIterator) *it;
	size_t slen, vlen;
	char *dest;
	
	/* no need for separator */
	if (!val) {
		slen = vlen = 0;
	}
	else {
		if (!sep) {
			sep = " ,;/:";
		}
		slen = strlen(sep);
		vlen = strlen(val);
	}
	/* memory for header, constent and string separation/end */
	if (!(it = malloc(sizeof(*it) + slen + vlen + 2))) {
		return 0;
	}
	it->_mt._vptr = &ctlMeta;
	it->_it._vptr = &ctlIter;
	
	it->elem._conv._vptr = &ctlConv;
	MPT_value_set(&it->elem.val, MPT_ENUM(TypeConvertablePtr), &it->conv_ptr);
	it->conv_ptr = &it->elem._conv;
	
	/* save separator config */
	dest = (char *) (it + 1);
	if (slen) {
		memcpy(dest, sep, slen);
	}
	dest[slen++] = '\0';
	
	/* save value content */
	dest += slen;
	if (vlen) {
		memcpy(dest, val, vlen);
	}
	dest[vlen] = '\0';
	
	/* setup iterator data */
	it->val = dest;
	it->end = dest + vlen;
	it->restore = 0;
	it->save = 0;
	
	return &it->_mt;
}